

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::hull
          (SelectionSet *__return_storage_ptr__,SelectionEvaluator *this,int frame)

{
  SelectionSet bs;
  SelectionSet local_50;
  SelectionSet local_38;
  
  createSelectionSets(&local_50,this);
  HullFinder::findHull(&local_38,&this->hullFinder,frame);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::_M_move_assign
            (&local_50.bitsets_,&local_38);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_38.bitsets_);
  SelectionSet::parallelReduce(__return_storage_ptr__,&local_50);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_50.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionEvaluator::hull(int frame) {
    SelectionSet bs = createSelectionSets();

    bs = hullFinder.findHull(frame);

    return bs.parallelReduce();
  }